

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbus.c
# Opt level: O0

int nn_xbus_create(void *hint,nn_sockbase **sockbase)

{
  nn_xbus *self_00;
  nn_xbus *self;
  nn_sockbase **sockbase_local;
  void *hint_local;
  
  self_00 = (nn_xbus *)nn_alloc_(0x1b0);
  if (self_00 == (nn_xbus *)0x0) {
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/bus/xbus.c"
            ,0xda);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_xbus_init(self_00,&nn_xbus_sockbase_vfptr,hint);
  *sockbase = (nn_sockbase *)self_00;
  return 0;
}

Assistant:

static int nn_xbus_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_xbus *self;

    self = nn_alloc (sizeof (struct nn_xbus), "socket (bus)");
    alloc_assert (self);
    nn_xbus_init (self, &nn_xbus_sockbase_vfptr, hint);
    *sockbase = &self->sockbase;

    return 0;
}